

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetPhotoSize(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  type_conflict4 tVar3;
  undefined8 *puVar4;
  self_type *psVar5;
  optional<int> oVar6;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  Ptr PVar8;
  locale local_90 [8];
  element_type *local_88;
  path_type local_80;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  *(undefined8 *)this = 0;
  local_88 = (element_type *)this;
  puVar4 = (undefined8 *)operator_new(0x40);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_002aa1a0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[2] = puVar4 + 4;
  puVar4[3] = 0;
  *(undefined1 *)(puVar4 + 4) = 0;
  *(undefined8 **)(this + 8) = puVar4;
  *(string **)this = (string *)(puVar4 + 2);
  paVar1 = &local_80.m_value.field_2;
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"file_id","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_80);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_50,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar5);
  std::__cxx11::string::operator=((string *)(puVar4 + 2),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"width","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_80);
  std::locale::locale(local_90);
  std::locale::locale((locale *)local_50,local_90);
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar5,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     local_50);
  std::locale::~locale((locale *)local_50);
  std::locale::~locale(local_90);
  *(type_conflict4 *)(puVar4 + 6) = tVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"height","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_80);
  std::locale::locale(local_90);
  std::locale::locale((locale *)local_50,local_90);
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar5,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     local_50);
  std::locale::~locale((locale *)local_50);
  std::locale::~locale(local_90);
  *(type_conflict4 *)((long)puVar4 + 0x34) = tVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  peVar2 = local_88;
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"file_size","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  oVar6 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_80);
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((ulong)oVar6.super_type & 1) != 0) {
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)oVar6.super_type >> 0x20);
  }
  *(int *)((peVar2->fileId)._M_dataplus._M_p + 0x28) = (int)_Var7._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
    _Var7._M_pi = extraout_RDX;
  }
  PVar8.super___shared_ptr<TgBot::PhotoSize,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  PVar8.super___shared_ptr<TgBot::PhotoSize,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (Ptr)PVar8.super___shared_ptr<TgBot::PhotoSize,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PhotoSize::Ptr TgTypeParser::parseJsonAndGetPhotoSize(const ptree& data) const {
    auto result(make_shared<PhotoSize>());
    result->fileId = data.get<string>("file_id");
    result->width = data.get<int32_t>("width");
    result->height = data.get<int32_t>("height");
    result->fileSize = data.get("file_size", 0);
    return result;
}